

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beman_s_challenge.cc
# Opt level: O2

int main(void)

{
  int iVar1;
  vec<float,_2UL> rhs;
  vec<float,_2UL> vVar2;
  vec2f vVar3;
  vec2f lhs;
  vec2i position_00;
  bool bVar4;
  bool bVar5;
  vec2i vVar6;
  long lVar7;
  window *pwVar8;
  vec2i position_01;
  long lVar9;
  long lVar10;
  string_view title;
  color4f color;
  color4f color_00;
  vec2f position;
  optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
  maybe_event;
  window window;
  float local_98;
  float fStack_94;
  float local_88;
  float fStack_84;
  renderer renderer;
  
  title._M_str = "Beman\'s challenge";
  title._M_len = 0x11;
  hmi::window::window(&window,title,(vec2i)0x24000000400,decorated|visible|resizable);
  hmi::window::get_renderer(&renderer,&window);
  rhs = hmi::operator*((vec<int,_2UL>)0x50000003d,(vec<float,_2UL>)0x411b54ce41200000);
  vVar6 = hmi::window::get_size(&window);
  vVar2 = hmi::operator-((vec<int,_2UL>)vVar6.field_0,rhs);
  fStack_94 = rhs.field_0._4_4_;
  position.field_0 = (anon_union_8_5_712f1eca_for_vec<float,_2UL>_2)hmi::operator/(vVar2,2);
  local_88 = 0.0;
  fStack_84 = 0.0;
  bVar5 = false;
  while( true ) {
    bVar4 = hmi::window::is_open(&window);
    if (!bVar4) break;
    while (pwVar8 = &window, hmi::window::poll_event(&maybe_event,&window),
          maybe_event.
          super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
          ._M_engaged != false) {
      switch(maybe_event.
             super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
             ._M_payload._M_value.
             super__Variant_base<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
             .
             super__Move_assign_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
             .
             super__Copy_assign_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
             .
             super__Move_ctor_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
             .
             super__Copy_ctor_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
             .
             super__Variant_storage_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
             ._M_index) {
      case '\0':
        renderer.m_view_size.field_0.data[1] =
             (float)(int)maybe_event.
                         super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                         ._M_payload._4_4_;
        renderer.m_view_size.field_0.data[0] =
             (float)(int)maybe_event.
                         super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                         ._M_payload._0_4_;
        break;
      case '\x01':
        hmi::window::close(&window,(int)pwVar8);
        break;
      case '\a':
        position_00.field_0.data[1] =
             maybe_event.
             super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
             ._M_payload._8_4_;
        position_00.field_0.data[0] =
             maybe_event.
             super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
             ._M_payload._4_4_;
        vVar3 = hmi::renderer::get_coords_from_position(&renderer,position_00);
        if ((((position.field_0.data[0] <= vVar3.field_0._0_4_) &&
             (local_98 = rhs.field_0._0_4_,
             vVar3.field_0._0_4_ <= position.field_0.data[0] + local_98)) &&
            (position.field_0.data[1] <= vVar3.field_0._4_4_)) &&
           (vVar3.field_0._4_4_ <= position.field_0.data[1] + fStack_94)) {
          local_88 = (float)(int)maybe_event.
                                 super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                                 ._M_payload._4_4_;
          fStack_84 = (float)(int)maybe_event.
                                  super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
                                  ._M_payload.
                                  super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                                  ._M_payload._8_4_;
          bVar5 = true;
        }
        break;
      case '\b':
        bVar5 = false;
        break;
      case '\t':
        if (bVar5) {
          position_01.field_0._0_4_ = (int)local_88;
          position_01.field_0.data[1] = (int)fStack_84;
          vVar3 = hmi::renderer::get_coords_from_position(&renderer,position_01);
          vVar6.field_0.data[1] =
               maybe_event.
               super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
               ._M_payload._4_4_;
          vVar6.field_0.data[0] =
               maybe_event.
               super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
               ._M_payload._0_4_;
          lhs = hmi::renderer::get_coords_from_position(&renderer,vVar6);
          vVar2 = hmi::operator-((vec<float,_2UL>)lhs.field_0,(vec<float,_2UL>)vVar3.field_0);
          hmi::operator+=(&position,vVar2);
        }
        local_88 = (float)(int)maybe_event.
                               super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                               ._M_payload._0_4_;
        fStack_84 = (float)(int)maybe_event.
                                super__Optional_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true,_true>
                                ._M_payload.
                                super__Optional_payload_base<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                                ._M_payload._4_4_;
      }
    }
    color.field_0._8_8_ = 0x3f8000003f800000;
    color.field_0._0_8_ = 0x3f8000003f800000;
    hmi::renderer::clear(&renderer,color);
    lVar7 = 0;
    for (lVar10 = 0; lVar10 != 5; lVar10 = lVar10 + 1) {
      iVar1 = (&_ZL12g_hello_text_rel)[lVar10];
      for (lVar9 = 0; vVar3.field_0 = position.field_0, lVar9 != 0x3d; lVar9 = lVar9 + 1) {
        if (*(char *)((long)&_ZL12g_hello_text_rel + iVar1 + lVar9) == '#') {
          vVar2 = hmi::operator*((vec<int,_2UL>)(lVar7 + lVar9),(vec<float,_2UL>)0x411b54ce41200000)
          ;
          vVar2 = hmi::operator+((vec<float,_2UL>)vVar3.field_0,vVar2);
          color_00.field_0._8_8_ = 0x3f80000000000000;
          color_00.field_0._0_8_ = 0x3f800000;
          hmi::renderer::fill_rectangle
                    (&renderer,(vec2f)vVar2.field_0,(vec2f)0x411b54ce41200000,color_00);
        }
      }
      lVar7 = lVar7 + 0x100000000;
    }
    hmi::renderer::display(&renderer);
  }
  hmi::renderer::~renderer(&renderer);
  hmi::window::~window(&window);
  return 0;
}

Assistant:

int main() {
  hmi::window window("Beman's challenge", { 1024, 576 });

  auto renderer = window.get_renderer();

  hmi::vec2i hello_size = { static_cast<int>(std::strlen(g_hello_text[0])), 5 };
  hmi::vec2f pixel_size = { 10.0f, 10.0f * 3 / 5 * 1.61803398875f };
  hmi::vec2f size = hello_size * pixel_size;

  hmi::vec2f position = (window.get_size() - size) / 2;
  bool dragging = false;
  hmi::vec2f mouse_position = { 0, 0 };

  while (window.is_open()) {

    while (auto maybe_event = window.poll_event()) {
      auto& event = maybe_event.value();

      if (std::get_if<hmi::window_events::closed>(&event)) {
        window.close();
      } else if (auto pevent = std::get_if<hmi::window_events::mouse_button_pressed>(&event)) {
        hmi::vec2f cursor = renderer.get_coords_from_position(pevent->position);

        if (position.x <= cursor.x && cursor.x <= position.x + size.width && position.y <= cursor.y && cursor.y <= position.y + size.height) {
          dragging = true;
          mouse_position = pevent->position;
        }
      } else if (std::get_if<hmi::window_events::mouse_button_released>(&event)) {
        dragging = false;
      } else if (auto pevent = std::get_if<hmi::window_events::mouse_moved>(&event)) {
        if (dragging) {
          hmi::vec2f old_cursor = renderer.get_coords_from_position(mouse_position);
          hmi::vec2f new_cursor = renderer.get_coords_from_position(pevent->position);
          position += (new_cursor - old_cursor);
        }

        mouse_position = pevent->position;
      } else if (auto pevent = std::get_if<hmi::window_events::resized>(&event)) {
        renderer.set_view_size(pevent->size);
      }

    }

    renderer.clear(hmi::color::white);

    hmi::vec2i index;

    for (index.y = 0; index.y < hello_size.height; index.y++) {
      for (index.x = 0; index.x < hello_size.width; ++index.x) {
        if (g_hello_text[index.y][index.x] == '#') {
          hmi::vec2f pixel_position = position + index * pixel_size;
          renderer.fill_rectangle(pixel_position, pixel_size, hmi::color::red);
        }
      }
    }

    renderer.display();
  }

  return 0;
}